

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::RgbaOutputFile::ToYca::ToYca(ToYca *this,OutputFile *outputFile,RgbaChannels rgbaChannels)

{
  int iVar1;
  int iVar2;
  int iVar3;
  LineOrder LVar4;
  byte bVar5;
  Header *pHVar7;
  Box2i *pBVar8;
  LineOrder *pLVar9;
  Rgba *pRVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  undefined8 local_38;
  float local_30;
  byte bVar6;
  
  *(undefined8 *)((long)&(this->super_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->super_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->_outputFile = outputFile;
  this->_writeY = (bool)((byte)(rgbaChannels >> 4) & 1);
  this->_writeC = (bool)((byte)rgbaChannels >> 5 & 1);
  this->_writeA = (bool)((byte)rgbaChannels >> 3 & 1);
  pHVar7 = OutputFile::header(outputFile);
  pBVar8 = Header::dataWindow(pHVar7);
  iVar1 = (pBVar8->min).x;
  iVar2 = (pBVar8->min).y;
  iVar3 = (pBVar8->max).x;
  iVar12 = (pBVar8->max).y;
  this->_xMin = iVar1;
  this->_width = (iVar3 - iVar1) + 1;
  this->_height = (iVar12 - iVar2) + 1;
  this->_linesConverted = 0;
  pHVar7 = OutputFile::header(this->_outputFile);
  pLVar9 = Header::lineOrder(pHVar7);
  LVar4 = *pLVar9;
  this->_lineOrder = LVar4;
  if (LVar4 == INCREASING_Y) {
    iVar12 = iVar2;
  }
  this->_currentScanLine = iVar12;
  pHVar7 = OutputFile::header(this->_outputFile);
  anon_unknown_1::ywFromHeader((anon_unknown_1 *)&local_38,pHVar7);
  (this->_yw).x = (float)(undefined4)local_38;
  (this->_yw).y = (float)local_38._4_4_;
  (this->_yw).z = local_30;
  iVar1 = this->_width;
  lVar13 = (long)iVar1;
  lVar11 = lVar13 * 8;
  bVar5 = 9;
  do {
    bVar6 = bVar5;
    bVar5 = bVar6 + 1;
  } while (1 < lVar11 >> (bVar5 & 0x3f));
  lVar14 = 1L << (bVar6 + 2 & 0x3f);
  lVar16 = lVar14 + -0x40;
  if (SBORROW8(lVar16,lVar11) == lVar16 + lVar13 * -8 < 0) {
    lVar14 = 1L << (bVar5 & 0x3f);
    lVar16 = lVar14 + 0x40;
    if (lVar16 == lVar11 || SBORROW8(lVar16,lVar11) != lVar16 + lVar13 * -8 < 0) {
      uVar15 = 0;
    }
    else {
      uVar15 = lVar14 + lVar13 * -8 + 0x40;
    }
  }
  else {
    uVar15 = lVar14 + lVar13 * -8 + 0x40;
  }
  lVar16 = (uVar15 >> 3) + lVar13;
  lVar11 = 0;
  pRVar10 = (Rgba *)operator_new__(-(ulong)((ulong)(lVar16 * 0x1b) >> 0x3d != 0) | lVar16 * 0xd8);
  this->_bufBase = pRVar10;
  do {
    this->_buf[lVar11] = pRVar10;
    lVar11 = lVar11 + 1;
    pRVar10 = pRVar10 + lVar16;
  } while (lVar11 != 0x1b);
  uVar15 = 0xffffffffffffffff;
  if (-0x1b < iVar1) {
    uVar15 = lVar13 * 8 + 0xd0;
  }
  pRVar10 = (Rgba *)operator_new__(uVar15);
  this->_tmpBuf = pRVar10;
  this->_fbBase = (Rgba *)0x0;
  this->_fbXStride = 0;
  this->_fbYStride = 0;
  this->_roundY = 7;
  this->_roundC = 5;
  return;
}

Assistant:

RgbaOutputFile::ToYca::ToYca (OutputFile& outputFile, RgbaChannels rgbaChannels)
    : _outputFile (outputFile)
{
    _writeY = (rgbaChannels & WRITE_Y) ? true : false;
    _writeC = (rgbaChannels & WRITE_C) ? true : false;
    _writeA = (rgbaChannels & WRITE_A) ? true : false;

    const Box2i dw = _outputFile.header ().dataWindow ();

    _xMin   = dw.min.x;
    _width  = dw.max.x - dw.min.x + 1;
    _height = dw.max.y - dw.min.y + 1;

    _linesConverted = 0;
    _lineOrder      = _outputFile.header ().lineOrder ();

    if (_lineOrder == INCREASING_Y)
        _currentScanLine = dw.min.y;
    else
        _currentScanLine = dw.max.y;

    _yw = ywFromHeader (_outputFile.header ());

    ptrdiff_t pad = cachePadding (_width * sizeof (Rgba)) / sizeof (Rgba);

    _bufBase = new Rgba[(_width + pad) * N];

    for (int i = 0; i < N; ++i)
        _buf[i] = _bufBase + (i * (_width + pad));

    _tmpBuf = new Rgba[_width + N - 1];

    _fbBase    = 0;
    _fbXStride = 0;
    _fbYStride = 0;

    _roundY = 7;
    _roundC = 5;
}